

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.hpp
# Opt level: O2

string * CLI::Timer::Simple(string *__return_storage_ptr__,string *title,string *time)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  std::operator+(&bStack_38,title,": ");
  std::operator+(__return_storage_ptr__,&bStack_38,time);
  std::__cxx11::string::~string((string *)&bStack_38);
  return __return_storage_ptr__;
}

Assistant:

static std::string Simple(std::string title, std::string time) { return title + ": " + time; }